

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall
cmFindPackageCommand::ReadListFile(cmFindPackageCommand *this,string *f,PolicyScopeRule psr)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string e;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  bVar2 = this->PolicyScope;
  this_00 = (this->super_cmFindCommon).Makefile;
  if (this->GlobalScope != false) {
    bVar1 = cmMakefile::IsImportedTargetGlobalScope(this_00);
    if (!bVar1) {
      this_00->CurrentImportedTargetScope = Global;
      bVar1 = true;
      goto LAB_002f730d;
    }
  }
  bVar1 = false;
LAB_002f730d:
  bVar2 = cmMakefile::ReadDependentFile
                    ((this->super_cmFindCommon).Makefile,f,(bool)(bVar2 ^ 1U | psr == NoPolicyScope)
                    );
  if (!bVar2) {
    local_40 = (f->_M_dataplus)._M_p;
    local_48 = f->_M_string_length;
    local_58._M_len = 0x1f;
    local_58._M_str = "Error reading CMake code from \"";
    local_38 = 2;
    local_30 = "\".";
    views._M_len = 3;
    views._M_array = &local_58;
    cmCatViews_abi_cxx11_(&local_78,views);
    cmFindCommon::SetError(&this->super_cmFindCommon,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar1) {
    this_00->CurrentImportedTargetScope = Local;
  }
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::ReadListFile(const std::string& f,
                                        const PolicyScopeRule psr)
{
  const bool noPolicyScope = !this->PolicyScope || psr == NoPolicyScope;

  using ITScope = cmMakefile::ImportedTargetScope;
  ITScope scope = this->GlobalScope ? ITScope::Global : ITScope::Local;
  cmMakefile::SetGlobalTargetImportScope globScope(this->Makefile, scope);

  if (this->Makefile->ReadDependentFile(f, noPolicyScope)) {
    return true;
  }
  std::string const e = cmStrCat("Error reading CMake code from \"", f, "\".");
  this->SetError(e);
  return false;
}